

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O3

FT_UInt32 FT_Stream_ReadULong(FT_Stream stream,FT_Error *error)

{
  uint uVar1;
  unsigned_long uVar2;
  FT_UInt32 FVar3;
  FT_Error FVar4;
  uint *puVar5;
  FT_Byte reads [4];
  uint local_2c;
  
  uVar2 = stream->pos;
  FVar4 = 0x55;
  FVar3 = 0;
  if (stream->size <= uVar2 + 3) goto LAB_00217c24;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (stream->base != (uchar *)0x0) {
      puVar5 = (uint *)(stream->base + uVar2);
      goto LAB_00217c10;
    }
    FVar3 = 0;
  }
  else {
    puVar5 = &local_2c;
    uVar2 = (*stream->read)(stream,uVar2,(uchar *)puVar5,4);
    FVar3 = 0;
    if (uVar2 != 4) goto LAB_00217c24;
    uVar2 = stream->pos;
LAB_00217c10:
    uVar1 = *puVar5;
    FVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  stream->pos = uVar2 + 4;
  FVar4 = 0;
LAB_00217c24:
  *error = FVar4;
  return FVar3;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Stream_ReadULong( FT_Stream  stream,
                       FT_Error*  error )
  {
    FT_Byte   reads[4];
    FT_Byte*  p;
    FT_UInt32 result = 0;


    FT_ASSERT( stream );

    if ( stream->pos + 3 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 4L ) != 4L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_ULONG( p );
    }
    else
      goto Fail;

    stream->pos += 4;

    *error = FT_Err_Ok;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadULong:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return result;
  }